

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

QString * __thiscall QAction::toolTip(QAction *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *d;
  QString *in_stack_ffffffffffffff98;
  QString *this_00;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QAction *)0x976427);
  bVar2 = QString::isEmpty((QString *)0x97643d);
  if (bVar2) {
    bVar2 = QString::isEmpty((QString *)0x976454);
    if (bVar2) {
      QString::QString(this_00,in_stack_ffffffffffffff98);
      qt_strippedText(in_stack_ffffffffffffffc8);
      QString::~QString((QString *)0x9764b8);
    }
    else {
      QString::QString(this_00,in_stack_ffffffffffffff98);
      qt_strippedText(in_stack_ffffffffffffffc8);
      QString::~QString((QString *)0x976487);
    }
  }
  else {
    QString::QString(this_00,in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAction::toolTip() const
{
    Q_D(const QAction);
    if (d->tooltip.isEmpty()) {
        if (!d->text.isEmpty())
            return qt_strippedText(d->text);
        return qt_strippedText(d->iconText);
    }
    return d->tooltip;
}